

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void __thiscall cmServerBase::AddNewConnection(cmServerBase *this,cmConnection *ownedConnection)

{
  unique_lock<cm::shared_mutex> lock;
  cmConnection *local_28;
  unique_lock<cm::shared_mutex> local_20;
  
  local_28 = ownedConnection;
  std::unique_lock<cm::shared_mutex>::unique_lock(&local_20,&this->ConnectionsMutex);
  std::
  vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>
  ::emplace_back<cmConnection*&>
            ((vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>
              *)&this->Connections,&local_28);
  std::unique_lock<cm::shared_mutex>::~unique_lock(&local_20);
  (*local_28->_vptr_cmConnection[5])(local_28,this);
  return;
}

Assistant:

void cmServerBase::AddNewConnection(cmConnection* ownedConnection)
{
  {
    std::unique_lock<cm::shared_mutex> lock(ConnectionsMutex);
    Connections.emplace_back(ownedConnection);
  }
  ownedConnection->SetServer(this);
}